

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_ctl.c
# Opt level: O2

void line_tilde_float(t_line *x,t_float f)

{
  float fVar1;
  
  fVar1 = x->x_inletvalue;
  if (fVar1 <= 0.0) {
    x->x_value = f;
    x->x_ticksleft = 0;
  }
  else {
    x->x_inletwas = fVar1;
    x->x_inletvalue = 0.0;
  }
  x->x_target = f;
  x->x_retarget = (uint)(fVar1 > 0.0);
  return;
}

Assistant:

static void line_tilde_float(t_line *x, t_float f)
{
    if (x->x_inletvalue <= 0)
    {
        x->x_target = x->x_value = f;
        x->x_ticksleft = x->x_retarget = 0;
    }
    else
    {
        x->x_target = f;
        x->x_retarget = 1;
        x->x_inletwas = x->x_inletvalue;
        x->x_inletvalue = 0;
    }
}